

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

void __thiscall zstr::ifstream::~ifstream(ifstream *this,void **vtt)

{
  byte bVar1;
  long lVar2;
  long *plVar3;
  undefined8 *in_RSI;
  ifstream *in_RDI;
  
  (in_RDI->super_istream)._vptr_basic_istream = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((long)&(in_RDI->super_istream)._vptr_basic_istream +
   (long)(in_RDI->super_istream)._vptr_basic_istream[-3]) = in_RSI[3];
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    close(in_RDI,(int)in_RSI);
  }
  lVar2 = std::ios::rdbuf();
  if ((lVar2 != 0) && (plVar3 = (long *)std::ios::rdbuf(), plVar3 != (long *)0x0)) {
    (**(code **)(*plVar3 + 8))();
  }
  std::istream::~istream(in_RDI);
  detail::strict_fstream_holder<strict_fstream::ifstream>::~strict_fstream_holder
            ((strict_fstream_holder<strict_fstream::ifstream> *)0x1fb711);
  return;
}

Assistant:

virtual ~ifstream() {
    if (_fs.is_open()) close();
    if (rdbuf()) delete rdbuf();
  }